

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

bool __thiscall
cmConditionEvaluator::HandleLevel4
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  _List_node_base *p_Var1;
  iterator iVar2;
  string *psVar3;
  MessageType *pMVar4;
  bool bVar5;
  cmConditionEvaluator *pcVar6;
  _Self __tmp_1;
  _Self __tmp;
  _List_node_base *p_Var7;
  bool bVar8;
  int reducible;
  iterator arg;
  allocator local_85;
  int local_84;
  iterator local_80;
  cmConditionEvaluator *local_78;
  iterator local_70;
  iterator local_68;
  string *local_60;
  MessageType *local_58;
  string local_50;
  
  local_78 = this;
  local_60 = errorString;
  local_58 = status;
  do {
    local_84 = 0;
    for (p_Var7 = (newArgs->
                  super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                  )._M_impl._M_node.super__List_node_base._M_next;
        p_Var7 != (_List_node_base *)newArgs;
        p_Var7 = (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                    *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
      p_Var1 = (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                  *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      local_80._M_node = p_Var1;
      local_70._M_node = p_Var1;
      local_68._M_node = p_Var7;
      if (p_Var1 != (_List_node_base *)newArgs) {
        local_80._M_node = p_Var1->_M_next;
        std::__cxx11::string::string((string *)&local_50,"AND",&local_85);
        bVar5 = IsKeyword(this,&local_50,(cmExpandedCommandArgument *)(p_Var1 + 1));
        iVar2._M_node = local_80._M_node;
        bVar8 = local_80._M_node != (_List_node_base *)newArgs;
        std::__cxx11::string::~string((string *)&local_50);
        pMVar4 = local_58;
        psVar3 = local_60;
        if (bVar5 && bVar8) {
          bVar5 = GetBooleanValueWithAutoDereference
                            (this,(cmExpandedCommandArgument *)(p_Var7 + 1),local_60,local_58,false)
          ;
          this = local_78;
          pcVar6 = local_78;
          bVar8 = GetBooleanValueWithAutoDereference
                            (local_78,(cmExpandedCommandArgument *)(iVar2._M_node + 1),psVar3,pMVar4
                             ,false);
          HandleBinaryOp(pcVar6,bVar8 && bVar5,&local_84,&local_68,newArgs,&local_70,&local_80);
        }
      }
      iVar2._M_node = local_70._M_node;
      if (local_70._M_node != (_List_node_base *)newArgs) {
        std::__cxx11::string::string((string *)&local_50,"OR",&local_85);
        bVar5 = IsKeyword(this,&local_50,(cmExpandedCommandArgument *)(iVar2._M_node + 1));
        iVar2._M_node = local_80._M_node;
        bVar8 = local_80._M_node != (_List_node_base *)newArgs;
        std::__cxx11::string::~string((string *)&local_50);
        pMVar4 = local_58;
        psVar3 = local_60;
        if (bVar5 && bVar8) {
          bVar5 = GetBooleanValueWithAutoDereference
                            (this,(cmExpandedCommandArgument *)(p_Var7 + 1),local_60,local_58,false)
          ;
          this = local_78;
          pcVar6 = local_78;
          bVar8 = GetBooleanValueWithAutoDereference
                            (local_78,(cmExpandedCommandArgument *)(iVar2._M_node + 1),psVar3,pMVar4
                             ,false);
          HandleBinaryOp(pcVar6,bVar8 || bVar5,&local_84,&local_68,newArgs,&local_70,&local_80);
        }
      }
    }
  } while (local_84 != 0);
  return true;
}

Assistant:

bool cmConditionEvaluator::HandleLevel4(cmArgumentList &newArgs,
                  std::string &errorString,
                  cmake::MessageType &status)
{
  int reducible;
  bool lhs;
  bool rhs;
  do
    {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    cmArgumentList::iterator argP1;
    cmArgumentList::iterator argP2;
    while (arg != newArgs.end())
      {
      argP1 = arg;
      IncrementArguments(newArgs,argP1,argP2);
      if (argP1 != newArgs.end() && IsKeyword("AND", *argP1) &&
        argP2 != newArgs.end())
        {
        lhs = this->GetBooleanValueWithAutoDereference(*arg,
                                                 errorString,
                                                 status);
        rhs = this->GetBooleanValueWithAutoDereference(*argP2,
                                                 errorString,
                                                 status);
        this->HandleBinaryOp((lhs && rhs),
          reducible, arg, newArgs, argP1, argP2);
        }

      if (argP1 != newArgs.end() && this->IsKeyword("OR", *argP1) &&
        argP2 != newArgs.end())
        {
        lhs = this->GetBooleanValueWithAutoDereference(*arg,
                                                 errorString,
                                                 status);
        rhs = this->GetBooleanValueWithAutoDereference(*argP2,
                                                 errorString,
                                                 status);
        this->HandleBinaryOp((lhs || rhs),
          reducible, arg, newArgs, argP1, argP2);
        }
      ++arg;
      }
    }
  while (reducible);
  return true;
}